

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mutex.h
# Opt level: O0

bool __thiscall llvm::sys::SmartMutex<false>::lock(SmartMutex<false> *this)

{
  bool bVar1;
  SmartMutex<false> *this_local;
  
  bVar1 = MutexImpl::acquire(&this->impl);
  return bVar1;
}

Assistant:

bool lock() {
        if (!mt_only || llvm_is_multithreaded()) {
          return impl.acquire();
        } else {
          // Single-threaded debugging code.  This would be racy in
          // multithreaded mode, but provides not sanity checks in single
          // threaded mode.
          assert((recursive || acquired == 0) && "Lock already acquired!!");
          ++acquired;
          return true;
        }
      }